

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

ssize_t __thiscall
perfetto::base::UnixSocketRaw::Send
          (UnixSocketRaw *this,void *msg,size_t len,int *send_fds,size_t num_fds)

{
  int iVar1;
  ssize_t sVar2;
  ulong uVar3;
  int *piVar4;
  cmsghdr *__cmsg;
  char *pcVar5;
  char *pcVar6;
  undefined4 extraout_var;
  char *pcVar7;
  ulong extraout_RDX;
  ulong *puVar8;
  cmsghdr *pcVar9;
  undefined1 *__dest;
  msghdr *pmVar10;
  UnixSocketRaw *pUVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  msghdr msg_hdr;
  iovec iov;
  char control_buf [256];
  ulong uStack_300;
  code *pcStack_2f8;
  msghdr mStack_2f0;
  iovec iStack_2b8;
  cmsghdr acStack_2a8 [16];
  UnixSocketRaw *pUStack_1a8;
  msghdr local_178;
  iovec local_140;
  ulong local_130 [2];
  undefined1 local_120 [240];
  
  local_178.msg_control = (ulong *)0x0;
  local_178.msg_controllen = 0;
  local_178.msg_name = (void *)0x0;
  local_178.msg_namelen = 0;
  local_178._12_4_ = 0;
  local_178.msg_flags = 0;
  local_178._52_4_ = 0;
  local_178.msg_iov = &local_140;
  local_178.msg_iovlen = 1;
  local_140.iov_base = msg;
  local_140.iov_len = len;
  if (num_fds == 0) {
LAB_002cdac4:
    sVar2 = SendMsgAllPosix(this,&local_178);
    return sVar2;
  }
  iVar1 = (int)(num_fds << 2);
  uVar13 = iVar1 + 0x17U & 0xfffffff8;
  uVar3 = (ulong)uVar13;
  if (uVar13 < 0x101) {
    memset(local_130,0,0x100);
    puVar8 = (ulong *)0x0;
    if (0xf < uVar3) {
      puVar8 = local_130;
    }
    puVar8[1] = 0x100000001;
    *puVar8 = (ulong)(iVar1 + 0x10);
    __dest = (undefined1 *)0x10;
    if (0xf < uVar3) {
      __dest = local_120;
    }
    local_178.msg_control = local_130;
    local_178.msg_controllen = uVar3;
    memcpy(__dest,send_fds,num_fds << 2);
    goto LAB_002cdac4;
  }
  pmVar10 = (msghdr *)this;
  Send();
  mStack_2f0.msg_control = (cmsghdr *)0x0;
  mStack_2f0.msg_controllen = 0;
  mStack_2f0.msg_name = (void *)0x0;
  mStack_2f0.msg_namelen = 0;
  mStack_2f0._12_4_ = 0;
  mStack_2f0._48_8_ = 0;
  mStack_2f0.msg_iov = &iStack_2b8;
  mStack_2f0.msg_iovlen = 1;
  iStack_2b8.iov_base = msg;
  pUStack_1a8 = this;
  if (num_fds != 0) {
    mStack_2f0.msg_control = acStack_2a8;
    uVar13 = (int)num_fds * 4 + 0x17U & 0xfffffff8;
    mStack_2f0.msg_controllen = (size_t)uVar13;
    if (0x100 < uVar13) {
LAB_002cdcf2:
      uVar13 = (uint)msg;
      pcStack_2f8 = (code *)0x2cdcf7;
      Receive();
      goto LAB_002cdcf7;
    }
  }
  while( true ) {
    uVar13 = (((UnixSocketRaw *)pmVar10)->fd_).t_;
    pUVar11 = (UnixSocketRaw *)(ulong)uVar13;
    pcStack_2f8 = (code *)0x2cdb6e;
    msg = &mStack_2f0;
    uVar3 = recvmsg(uVar13,&mStack_2f0,0);
    uVar13 = (uint)msg;
    if (uVar3 != 0xffffffffffffffff) break;
    pcStack_2f8 = (code *)0x2cdb79;
    piVar4 = __errno_location();
    if (*piVar4 != 4) {
      return -1;
    }
  }
  if ((long)uVar3 < 1) {
    return uVar3;
  }
  pmVar10 = (msghdr *)pUVar11;
  if (uVar3 <= extraout_RDX) {
    if (num_fds == 0) {
      pcVar9 = (cmsghdr *)0x0;
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      pcVar9 = (cmsghdr *)0x0;
      if ((cmsghdr *)mStack_2f0.msg_control != (cmsghdr *)0x0 && 0xf < mStack_2f0.msg_controllen) {
        pcVar9 = (cmsghdr *)0x0;
        __cmsg = (cmsghdr *)mStack_2f0.msg_control;
        do {
          if ((__cmsg->cmsg_level == 1) && (__cmsg->cmsg_type == 1)) {
            if (pcVar9 != (cmsghdr *)0x0) {
              pcStack_2f8 = (code *)0x2cdcf2;
              Receive();
              goto LAB_002cdcf2;
            }
            pcVar9 = __cmsg + 1;
            uVar14 = __cmsg->cmsg_len + 0x3fffffff0 >> 2;
          }
          pcStack_2f8 = (code *)0x2cdbfa;
          msg = __cmsg;
          pmVar10 = &mStack_2f0;
          __cmsg = __cmsg_nxthdr(&mStack_2f0,__cmsg);
        } while (__cmsg != (cmsghdr *)0x0);
        uVar14 = uVar14 & 0xffffffff;
      }
    }
    if ((mStack_2f0._48_8_ & 0x28) == 0) {
      if (uVar14 != 0 && pcVar9 != (cmsghdr *)0x0) {
        uVar12 = 0;
        do {
          if (uVar12 < num_fds) {
            pcStack_2f8 = (code *)0x2cdcd3;
            ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
            ::reset((ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
                     *)send_fds,*(int *)((long)&pcVar9->cmsg_len + uVar12 * 4));
          }
          else {
            pcStack_2f8 = (code *)0x2cdcdf;
            close(*(int *)((long)&pcVar9->cmsg_len + uVar12 * 4));
          }
          uVar12 = uVar12 + 1;
          send_fds = &((ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
                        *)send_fds)[1].t_;
        } while (uVar12 < uVar14);
        return uVar3;
      }
      return uVar3;
    }
    if (uVar14 != 0 && pcVar9 != (cmsghdr *)0x0) {
      uVar3 = 0;
      do {
        pcStack_2f8 = (code *)0x2cdc31;
        close(*(int *)((long)&pcVar9->cmsg_len + uVar3 * 4));
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar14);
    }
    pcVar5 = "/";
    do {
      pcVar7 = pcVar5 + 2;
      pcVar5 = pcVar5 + 1;
    } while (*pcVar7 != '\0');
    pcVar7 = "";
    do {
      pcVar6 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
    } while (*pcVar6 != '\0');
    do {
      pcVar6 = pcVar5;
      if (pcVar6 + 1 <
          "workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
         ) break;
      pcVar5 = pcVar6 + -1;
    } while ((pcVar7 <= pcVar6) || (*pcVar6 != '/'));
    pcStack_2f8 = (code *)0x2cdc93;
    LogMessage(kLogError,pcVar6 + 1,0x10873,
               "Socket message truncated. This might be due to a SELinux denial on fd:use.");
    pcStack_2f8 = (code *)0x2cdc98;
    piVar4 = __errno_location();
    *piVar4 = 0x5a;
    return -1;
  }
LAB_002cdcf7:
  pcStack_2f8 = SetTxTimeout;
  Receive();
  ((UnixSocketRaw *)pmVar10)->tx_timeout_ms_ = uVar13;
  uStack_300 = (ulong)uVar13 / 1000;
  pcStack_2f8 = (code *)(ulong)((uVar13 % 1000) * 1000);
  iVar1 = setsockopt((((UnixSocketRaw *)pmVar10)->fd_).t_,1,0x15,&uStack_300,0x10);
  return CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),iVar1 == 0);
}

Assistant:

ssize_t UnixSocketRaw::Send(const void* msg,
                            size_t len,
                            const int* send_fds,
                            size_t num_fds) {
  PERFETTO_DCHECK(fd_);
  msghdr msg_hdr = {};
  iovec iov = {const_cast<void*>(msg), len};
  msg_hdr.msg_iov = &iov;
  msg_hdr.msg_iovlen = 1;
  alignas(cmsghdr) char control_buf[256];

  if (num_fds > 0) {
    const auto raw_ctl_data_sz = num_fds * sizeof(int);
    const CBufLenType control_buf_len =
        static_cast<CBufLenType>(CMSG_SPACE(raw_ctl_data_sz));
    PERFETTO_CHECK(control_buf_len <= sizeof(control_buf));
    memset(control_buf, 0, sizeof(control_buf));
    msg_hdr.msg_control = control_buf;
    msg_hdr.msg_controllen = control_buf_len;  // used by CMSG_FIRSTHDR
    struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg_hdr);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = static_cast<CBufLenType>(CMSG_LEN(raw_ctl_data_sz));
    memcpy(CMSG_DATA(cmsg), send_fds, num_fds * sizeof(int));
    // note: if we were to send multiple cmsghdr structures, then
    // msg_hdr.msg_controllen would need to be adjusted, see "man 3 cmsg".
  }

  return SendMsgAllPosix(&msg_hdr);
}